

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

idx_t duckdb::BinaryExecutor::SelectGenericLoop<short,short,duckdb::GreaterThan,true,true,false>
                (short *ldata,short *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  SelectionVector *this;
  idx_t idx;
  idx_t loc;
  SelectionVector *in_RCX;
  SelectionVector *in_RDX;
  long in_RSI;
  long in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  idx_t rindex;
  idx_t lindex;
  idx_t result_idx;
  idx_t i;
  idx_t false_count;
  idx_t true_count;
  undefined8 local_48;
  undefined8 local_38;
  
  local_38 = 0;
  for (local_48 = 0; local_48 < in_R9; local_48 = local_48 + 1) {
    this = (SelectionVector *)SelectionVector::get_index(in_R8,local_48);
    idx = SelectionVector::get_index(in_RDX,local_48);
    loc = SelectionVector::get_index(in_RCX,local_48);
    bVar1 = GreaterThan::Operation<short>((short *)(in_RDI + idx * 2),(short *)(in_RSI + loc * 2));
    if (bVar1) {
      local_38 = local_38 + 1;
      SelectionVector::set_index(this,idx,loc);
    }
  }
  return local_38;
}

Assistant:

static inline idx_t
	SelectGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                  const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                  const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                  ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
#ifdef DUCKDB_SMALLER_BINARY
		const bool HAS_TRUE_SEL = true_sel;
		const bool HAS_FALSE_SEL = false_sel;
		const bool NO_NULL = false;
#endif
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto lindex = lsel->get_index(i);
			auto rindex = rsel->get_index(i);
			if ((NO_NULL || (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex))) &&
			    OP::Operation(ldata[lindex], rdata[rindex])) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}